

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparamsbase.cpp
# Opt level: O1

unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_>
CreateBaseChainParams(ChainType chain)

{
  undefined4 in_ESI;
  char *__args_1;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<CBaseChainParams,_std::default_delete<CBaseChainParams>,_true,_true> __args;
  long in_FS_OFFSET;
  int local_14;
  long local_10;
  
  __args.super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>._M_t.
  super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
  super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl._4_4_ = in_register_0000003c;
  __args.super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>._M_t.
  super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
  super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl._0_4_ = chain;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_ESI) {
  case 0:
    local_14 = 0x208c;
    std::make_unique<CBaseChainParams,char_const(&)[1],int,int>
              ((char (*) [1])
               __args.
               super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>._M_t.
               super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
               super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl,(int *)0x880856,
               &local_14);
    break;
  case 1:
    local_14 = 0x479c;
    __args_1 = "testnet3";
    goto LAB_00671561;
  case 2:
    local_14 = 0x95bc;
    std::make_unique<CBaseChainParams,char_const(&)[7],int,int>
              ((char (*) [7])
               __args.
               super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>._M_t.
               super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
               super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl,(int *)0x813957,
               &local_14);
    break;
  case 3:
    local_14 = 0x480b;
    std::make_unique<CBaseChainParams,char_const(&)[8],int,int>
              ((char (*) [8])
               __args.
               super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>._M_t.
               super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
               super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl,(int *)0x86356c,
               &local_14);
    break;
  case 4:
    local_14 = 0xbccc;
    __args_1 = "testnet4";
LAB_00671561:
    std::make_unique<CBaseChainParams,char_const(&)[9],int,int>
              ((char (*) [9])
               __args.
               super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>._M_t.
               super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
               super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl,(int *)__args_1,
               &local_14);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chainparamsbase.cpp"
                  ,0x36,"std::unique_ptr<CBaseChainParams> CreateBaseChainParams(const ChainType)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<CBaseChainParams,_std::default_delete<CBaseChainParams>,_true,_true>)
         (tuple<CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>)
         __args.super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>._M_t
         .super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
         super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<CBaseChainParams> CreateBaseChainParams(const ChainType chain)
{
    switch (chain) {
    case ChainType::MAIN:
        return std::make_unique<CBaseChainParams>("", 8332, 8334);
    case ChainType::TESTNET:
        return std::make_unique<CBaseChainParams>("testnet3", 18332, 18334);
    case ChainType::TESTNET4:
        return std::make_unique<CBaseChainParams>("testnet4", 48332, 48334);
    case ChainType::SIGNET:
        return std::make_unique<CBaseChainParams>("signet", 38332, 38334);
    case ChainType::REGTEST:
        return std::make_unique<CBaseChainParams>("regtest", 18443, 18445);
    }
    assert(false);
}